

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcondensedcompel.cpp
# Opt level: O2

void __thiscall
TPZCondensedCompEl::TPZCondensedCompEl
          (TPZCondensedCompEl *this,TPZCondensedCompEl *copy,TPZCompMesh *mesh)

{
  TPZManVector<long,_62> *this_00;
  long *plVar1;
  uint uVar2;
  TPZCompEl *this_01;
  TPZCompMesh *pTVar3;
  TPZGeoEl *pTVar4;
  TPZCompEl **ppTVar5;
  ulong uVar6;
  ulong uVar7;
  
  *(undefined ***)&this->super_TPZCompEl = &PTR__TPZSavable_01771cb0;
  TPZCompEl::TPZCompEl(&this->super_TPZCompEl,&PTR_PTR_01771990);
  *(undefined ***)&this->super_TPZCompEl = &PTR__TPZCondensedCompEl_01771740;
  this->fNumInternalEqs = 0;
  this->fNumTotalEqs = 0;
  TPZMatRed<double,_TPZFMatrix<double>_>::TPZMatRed(&this->fCondensed);
  this_00 = &this->fIndexes;
  TPZManVector<long,_62>::TPZManVector(this_00,0);
  TPZManVector<long,_55>::TPZManVector(&this->fCondensedConnectIndexes,0);
  TPZManVector<long,_10>::TPZManVector(&this->fActiveConnectIndexes,0);
  this->fKeepMatrix = true;
  this_01 = (TPZCompEl *)
            (**(code **)(*(long *)this->fReferenceCompEl + 0x48))(this->fReferenceCompEl,mesh);
  if (this_01 == (TPZCompEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcondensedcompel.cpp"
               ,0x55);
  }
  this->fReferenceCompEl = this_01;
  pTVar3 = TPZCompEl::Mesh(this_01);
  (this->super_TPZCompEl).fMesh = pTVar3;
  this->fKeepMatrix = copy->fKeepMatrix;
  pTVar4 = TPZCompEl::Reference(this_01);
  (this->super_TPZCompEl).fReferenceIndex = pTVar4->fIndex;
  TPZCompEl::SetIndex(&this->super_TPZCompEl,this_01->fIndex);
  ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                      (&(((this->super_TPZCompEl).fMesh)->fElementVec).
                        super_TPZChunkVector<TPZCompEl_*,_10>,(this->super_TPZCompEl).fIndex);
  *ppTVar5 = &this->super_TPZCompEl;
  uVar2 = (**(code **)(*(long *)this_01 + 0x90))(this_01);
  (*(this_00->super_TPZVec<long>)._vptr_TPZVec[3])(this_00,(long)(int)uVar2);
  plVar1 = (this->fIndexes).super_TPZVec<long>.fStore;
  uVar6 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    plVar1[uVar6] = uVar6;
  }
  return;
}

Assistant:

TPZCondensedCompEl::TPZCondensedCompEl(const TPZCondensedCompEl &copy, TPZCompMesh &mesh) : TPZRegisterClassId(&TPZCondensedCompEl::ClassId)
{
    TPZCompEl *ref = fReferenceCompEl->Clone(mesh);
    if(!ref)
    {
        DebugStop();
    }
    fReferenceCompEl = ref;
    fMesh = ref->Mesh();
    fKeepMatrix = copy.fKeepMatrix;
    SetReference(ref->Reference()->Index());
    SetIndex(ref->Index());
    fMesh->ElementVec()[fIndex] = this;
    int ncon = ref->NConnects();
    fIndexes.resize(ncon);
    for (int i=0; i<ncon ; ++i) {
        fIndexes[i] = i;
    }
}